

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
emplaceRealloc<slang::IntervalMapDetails::Path::Entry>
          (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *this,pointer pos,Entry *args)

{
  ulong uVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  Entry *__cur_1;
  pointer pEVar6;
  pointer pEVar7;
  pointer pEVar8;
  pointer pEVar9;
  EVP_PKEY_CTX *pEVar10;
  EVP_PKEY_CTX *ctx;
  long lVar11;
  
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar10 = (EVP_PKEY_CTX *)(this->len + 1);
  uVar1 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar1 * 2);
  if (pEVar10 < ctx) {
    pEVar10 = ctx;
  }
  if (0x7ffffffffffffff - uVar1 < uVar1) {
    pEVar10 = (EVP_PKEY_CTX *)0x7ffffffffffffff;
  }
  lVar11 = (long)pos - (long)this->data_;
  pEVar6 = (pointer)operator_new((long)pEVar10 << 4);
  uVar3 = *(undefined8 *)&args->size;
  *(undefined8 *)((long)pEVar6 + lVar11) = args->node;
  ((undefined8 *)((long)pEVar6 + lVar11))[1] = uVar3;
  pEVar9 = this->data_;
  pEVar7 = pEVar9 + this->len;
  pEVar8 = pEVar6;
  if (pEVar7 == pos) {
    for (; pEVar9 != pos; pEVar9 = pEVar9 + 1) {
      uVar4 = pEVar9->size;
      uVar5 = pEVar9->offset;
      pEVar8->node = pEVar9->node;
      pEVar8->size = uVar4;
      pEVar8->offset = uVar5;
      pEVar8 = pEVar8 + 1;
    }
  }
  else {
    for (; pEVar9 != pos; pEVar9 = pEVar9 + 1) {
      uVar4 = pEVar9->size;
      uVar5 = pEVar9->offset;
      pEVar8->node = pEVar9->node;
      pEVar8->size = uVar4;
      pEVar8->offset = uVar5;
      pEVar8 = pEVar8 + 1;
    }
    puVar2 = (undefined8 *)(lVar11 + (long)pEVar6);
    for (; pos != pEVar7; pos = pos + 1) {
      uVar3 = *(undefined8 *)&pos->size;
      puVar2[2] = pos->node;
      puVar2[3] = uVar3;
      puVar2 = puVar2 + 2;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pEVar10;
  this->data_ = pEVar6;
  return (pointer)((long)pEVar6 + lVar11);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}